

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

SchemaCatalogEntry * __thiscall duckdb::Binder::BindSchema(Binder *this,CreateInfo *info)

{
  string *catalog;
  string *schema;
  bool bVar1;
  ClientData *pCVar2;
  pointer pCVar3;
  ParserException *pPVar4;
  SchemaCatalogEntry *pSVar5;
  StatementProperties *this_00;
  string *this_01;
  unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
  *this_02;
  allocator local_51;
  string local_50;
  
  catalog = &info->catalog;
  schema = &info->schema;
  BindSchemaOrCatalog(this,catalog,schema);
  bVar1 = IsInvalidCatalog((string *)catalog);
  if ((bVar1) && (info->temporary == true)) {
    ::std::__cxx11::string::assign((char *)catalog);
  }
  pCVar2 = ClientData::Get(this->context);
  this_02 = &pCVar2->catalog_search_path;
  bVar1 = IsInvalidCatalog((string *)catalog);
  if (bVar1) {
    bVar1 = IsInvalidSchema((string *)schema);
    if (bVar1) {
      pCVar3 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
               ::operator->(this_02);
      CatalogSearchPath::GetDefault(pCVar3);
      ::std::__cxx11::string::_M_assign((string *)catalog);
      ::std::__cxx11::string::_M_assign((string *)schema);
      goto LAB_012b3466;
    }
  }
  bVar1 = IsInvalidSchema((string *)schema);
  if (bVar1) {
    pCVar3 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator->(this_02);
    CatalogSearchPath::GetDefaultSchema(&local_50,pCVar3,this->context,catalog);
    this_01 = (string *)schema;
  }
  else {
    bVar1 = IsInvalidCatalog((string *)catalog);
    if (!bVar1) goto LAB_012b3466;
    pCVar3 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
             ::operator->(this_02);
    CatalogSearchPath::GetDefaultCatalog(&local_50,pCVar3,schema);
    this_01 = (string *)catalog;
  }
  ::std::__cxx11::string::operator=(this_01,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
LAB_012b3466:
  bVar1 = IsInvalidCatalog((string *)catalog);
  if (bVar1) {
    DatabaseManager::GetDefaultDatabase_abi_cxx11_(this->context);
    ::std::__cxx11::string::_M_assign((string *)catalog);
  }
  if (info->temporary == false) {
    bVar1 = ::std::operator==(catalog,"temp");
    if (bVar1) {
      pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Only TEMPORARY table names can use the \"%s\" catalog",
                 &local_51);
      ParserException::ParserException<char_const*>(pPVar4,&local_50,"temp");
      __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar1 = ::std::operator!=(catalog,"temp");
    if (bVar1) {
      pPVar4 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"TEMPORARY table names can *only* use the \"%s\" catalog",
                 &local_51);
      ParserException::ParserException<char_const*>(pPVar4,&local_50,"temp");
      __cxa_throw(pPVar4,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pSVar5 = Catalog::GetSchema(this->context,catalog,schema);
  ::std::__cxx11::string::_M_assign((string *)schema);
  if (info->temporary == false) {
    this_00 = GetStatementProperties(this);
    StatementProperties::RegisterDBModify
              (this_00,(pSVar5->super_InCatalogEntry).catalog,this->context);
  }
  return pSVar5;
}

Assistant:

SchemaCatalogEntry &Binder::BindSchema(CreateInfo &info) {
	BindSchemaOrCatalog(info.catalog, info.schema);
	if (IsInvalidCatalog(info.catalog) && info.temporary) {
		info.catalog = TEMP_CATALOG;
	}
	auto &search_path = ClientData::Get(context).catalog_search_path;
	if (IsInvalidCatalog(info.catalog) && IsInvalidSchema(info.schema)) {
		auto &default_entry = search_path->GetDefault();
		info.catalog = default_entry.catalog;
		info.schema = default_entry.schema;
	} else if (IsInvalidSchema(info.schema)) {
		info.schema = search_path->GetDefaultSchema(context, info.catalog);
	} else if (IsInvalidCatalog(info.catalog)) {
		info.catalog = search_path->GetDefaultCatalog(info.schema);
	}
	if (IsInvalidCatalog(info.catalog)) {
		info.catalog = DatabaseManager::GetDefaultDatabase(context);
	}
	if (!info.temporary) {
		// non-temporary create: not read only
		if (info.catalog == TEMP_CATALOG) {
			throw ParserException("Only TEMPORARY table names can use the \"%s\" catalog", TEMP_CATALOG);
		}
	} else {
		if (info.catalog != TEMP_CATALOG) {
			throw ParserException("TEMPORARY table names can *only* use the \"%s\" catalog", TEMP_CATALOG);
		}
	}
	// fetch the schema in which we want to create the object
	auto &schema_obj = Catalog::GetSchema(context, info.catalog, info.schema);
	D_ASSERT(schema_obj.type == CatalogType::SCHEMA_ENTRY);
	info.schema = schema_obj.name;
	if (!info.temporary) {
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(schema_obj.catalog, context);
	}
	return schema_obj;
}